

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CategoricalMapping::CategoricalMapping
          (CategoricalMapping *this,CategoricalMapping *from)

{
  uint32 uVar1;
  void *pvVar2;
  Int64ToStringMap *this_00;
  StringToInt64Map *this_01;
  Int64ToStringMap *from_00;
  StringToInt64Map *from_01;
  ValueOnUnknownUnion VVar3;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__CategoricalMapping_003dd0f8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 1) {
    clear_MappingType(this);
    this->_oneof_case_[0] = 1;
    this_01 = (StringToInt64Map *)operator_new(0x38);
    StringToInt64Map::StringToInt64Map(this_01);
    (this->MappingType_).stringtoint64map_ = this_01;
    if (from->_oneof_case_[0] == 1) {
      from_01 = (from->MappingType_).stringtoint64map_;
    }
    else {
      from_01 = StringToInt64Map::default_instance();
    }
    StringToInt64Map::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 2) {
    clear_MappingType(this);
    this->_oneof_case_[0] = 2;
    this_00 = (Int64ToStringMap *)operator_new(0x38);
    Int64ToStringMap::Int64ToStringMap(this_00);
    (this->MappingType_).int64tostringmap_ = this_00;
    if (from->_oneof_case_[0] == 2) {
      from_00 = (from->MappingType_).int64tostringmap_;
    }
    else {
      from_00 = Int64ToStringMap::default_instance();
    }
    Int64ToStringMap::MergeFrom(this_00,from_00);
  }
  this->_oneof_case_[1] = 0;
  uVar1 = from->_oneof_case_[1];
  if (uVar1 == 0x66) {
    if (uVar1 == 0x66) {
      VVar3 = from->ValueOnUnknown_;
    }
    else {
      VVar3.int64value_ = 0;
    }
    clear_ValueOnUnknown(this);
    this->_oneof_case_[1] = 0x66;
    this->ValueOnUnknown_ = VVar3;
  }
  else if (uVar1 == 0x65) {
    VVar3.int64value_ = (int64)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    if (uVar1 == 0x65) {
      VVar3 = from->ValueOnUnknown_;
    }
    clear_ValueOnUnknown(this);
    this->_oneof_case_[1] = 0x65;
    (this->ValueOnUnknown_).int64value_ =
         (int64)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(this->ValueOnUnknown_).strvalue_,(string *)VVar3);
  }
  return;
}

Assistant:

CategoricalMapping::CategoricalMapping(const CategoricalMapping& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_MappingType();
  switch (from.MappingType_case()) {
    case kStringToInt64Map: {
      mutable_stringtoint64map()->::CoreML::Specification::StringToInt64Map::MergeFrom(from.stringtoint64map());
      break;
    }
    case kInt64ToStringMap: {
      mutable_int64tostringmap()->::CoreML::Specification::Int64ToStringMap::MergeFrom(from.int64tostringmap());
      break;
    }
    case MAPPINGTYPE_NOT_SET: {
      break;
    }
  }
  clear_has_ValueOnUnknown();
  switch (from.ValueOnUnknown_case()) {
    case kStrValue: {
      set_strvalue(from.strvalue());
      break;
    }
    case kInt64Value: {
      set_int64value(from.int64value());
      break;
    }
    case VALUEONUNKNOWN_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CategoricalMapping)
}